

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O3

uint estimate_scroll_motion
               (AV1_COMP *cpi,uint8_t *src_buf,uint8_t *last_src_buf,int src_stride,int ref_stride,
               BLOCK_SIZE bsize,int pos_col,int pos_row,int *best_intmv_col,int *best_intmv_row,
               int sw_col,int sw_row)

{
  int *piVar1;
  uint uVar2;
  int16_t *ref;
  int16_t *ref_00;
  int16_t *src;
  int16_t *src_00;
  int iVar3;
  int iVar4;
  undefined7 in_register_00000089;
  undefined1 auVar5 [16];
  undefined4 in_stack_00000014;
  int best_sad_row;
  int best_sad_col;
  uint local_38;
  uint local_34;
  
  uVar2 = (cpi->oxcf).border_in_pixels & 0xfffffff0;
  iVar4 = (int)CONCAT71(in_register_00000089,bsize);
  iVar3 = iVar4 - (uint)best_intmv_row;
  if ((SBORROW4(iVar3,-uVar2) != (int)(iVar3 + uVar2) < 0) ||
     ((int)((cpi->common).width + uVar2) < (int)(iVar4 + (uint)best_intmv_row))) {
    best_intmv_row._0_4_ = uVar2;
  }
  if ((SBORROW4(pos_col - sw_col,-uVar2) != (int)((pos_col - sw_col) + uVar2) < 0) ||
     ((int)((cpi->common).height + uVar2) < pos_col + sw_col)) {
    sw_col = uVar2;
  }
  ref = (int16_t *)aom_malloc((long)(int)((uint)best_intmv_row * 2) * 2 + 0x100);
  ref_00 = (int16_t *)aom_malloc((long)(sw_col * 2) * 2 + 0x100);
  src = (int16_t *)aom_malloc(0x100);
  src_00 = (int16_t *)aom_malloc(0x100);
  auVar5._0_4_ = -(uint)((int)((ulong)ref >> 0x20) == 0 && (int)ref == 0);
  auVar5._4_4_ = -(uint)((int)ref_00 == 0 && (int)((ulong)ref_00 >> 0x20) == 0);
  auVar5._8_4_ = -(uint)((int)((ulong)src >> 0x20) == 0 && (int)src == 0);
  auVar5._12_4_ = -(uint)((int)src_00 == 0 && (int)((ulong)src_00 >> 0x20) == 0);
  iVar3 = movmskps((int)src_00,auVar5);
  if (iVar3 != 0) {
    aom_free(ref);
    aom_free(ref_00);
    aom_free(src);
    aom_free(src_00);
    aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                       "Failed to allocate hbuf, vbuf, src_hbuf, or src_vbuf");
  }
  (*aom_int_pro_row)(ref,last_src_buf + -(long)(int)(uint)best_intmv_row,ref_stride,
                     (uint)best_intmv_row * 2 + 0x80,0x80,6);
  (*aom_int_pro_col)(ref_00,last_src_buf + -(long)(sw_col * ref_stride),ref_stride,0x80,
                     sw_col * 2 + 0x80,7);
  (*aom_int_pro_row)(src,src_buf,src_stride,0x80,0x80,6);
  (*aom_int_pro_col)(src_00,src_buf,src_stride,0x80,0x80,7);
  iVar3 = av1_vector_match(ref,src,5,(uint)best_intmv_row,1,(int *)&local_34);
  *(int *)CONCAT44(in_stack_00000014,pos_row) = iVar3;
  iVar3 = av1_vector_match(ref_00,src_00,5,sw_col,1,(int *)&local_38);
  *best_intmv_col = iVar3;
  piVar1 = (int *)CONCAT44(in_stack_00000014,pos_row);
  if ((int)local_34 < (int)local_38) {
    local_38 = local_34;
    piVar1 = best_intmv_col;
  }
  *piVar1 = 0;
  aom_free(ref);
  aom_free(ref_00);
  aom_free(src);
  aom_free(src_00);
  return local_38;
}

Assistant:

static unsigned int estimate_scroll_motion(
    const AV1_COMP *cpi, uint8_t *src_buf, uint8_t *last_src_buf,
    int src_stride, int ref_stride, BLOCK_SIZE bsize, int pos_col, int pos_row,
    int *best_intmv_col, int *best_intmv_row, int sw_col, int sw_row) {
  const AV1_COMMON *const cm = &cpi->common;
  const int bw = block_size_wide[bsize];
  const int bh = block_size_high[bsize];
  const int full_search = 1;
  // Keep border a multiple of 16.
  const int border = (cpi->oxcf.border_in_pixels >> 4) << 4;
  int search_size_width = sw_col;
  int search_size_height = sw_row;
  // Adjust based on boundary.
  if ((pos_col - search_size_width < -border) ||
      (pos_col + search_size_width > cm->width + border))
    search_size_width = border;
  if ((pos_row - search_size_height < -border) ||
      (pos_row + search_size_height > cm->height + border))
    search_size_height = border;
  const uint8_t *ref_buf;
  const int row_norm_factor = mi_size_high_log2[bsize] + 1;
  const int col_norm_factor = 3 + (bw >> 5);
  const int ref_buf_width = (search_size_width << 1) + bw;
  const int ref_buf_height = (search_size_height << 1) + bh;
  int16_t *hbuf = (int16_t *)aom_malloc(ref_buf_width * sizeof(*hbuf));
  int16_t *vbuf = (int16_t *)aom_malloc(ref_buf_height * sizeof(*vbuf));
  int16_t *src_hbuf = (int16_t *)aom_malloc(bw * sizeof(*src_hbuf));
  int16_t *src_vbuf = (int16_t *)aom_malloc(bh * sizeof(*src_vbuf));
  if (!hbuf || !vbuf || !src_hbuf || !src_vbuf) {
    aom_free(hbuf);
    aom_free(vbuf);
    aom_free(src_hbuf);
    aom_free(src_vbuf);
    aom_internal_error(cm->error, AOM_CODEC_MEM_ERROR,
                       "Failed to allocate hbuf, vbuf, src_hbuf, or src_vbuf");
  }
  // Set up prediction 1-D reference set for rows.
  ref_buf = last_src_buf - search_size_width;
  aom_int_pro_row(hbuf, ref_buf, ref_stride, ref_buf_width, bh,
                  row_norm_factor);
  // Set up prediction 1-D reference set for cols
  ref_buf = last_src_buf - search_size_height * ref_stride;
  aom_int_pro_col(vbuf, ref_buf, ref_stride, bw, ref_buf_height,
                  col_norm_factor);
  // Set up src 1-D reference set
  aom_int_pro_row(src_hbuf, src_buf, src_stride, bw, bh, row_norm_factor);
  aom_int_pro_col(src_vbuf, src_buf, src_stride, bw, bh, col_norm_factor);
  unsigned int best_sad;
  int best_sad_col, best_sad_row;
  // Find the best match per 1-D search
  *best_intmv_col =
      av1_vector_match(hbuf, src_hbuf, mi_size_wide_log2[bsize],
                       search_size_width, full_search, &best_sad_col);
  *best_intmv_row =
      av1_vector_match(vbuf, src_vbuf, mi_size_high_log2[bsize],
                       search_size_height, full_search, &best_sad_row);
  if (best_sad_col < best_sad_row) {
    *best_intmv_row = 0;
    best_sad = best_sad_col;
  } else {
    *best_intmv_col = 0;
    best_sad = best_sad_row;
  }
  aom_free(hbuf);
  aom_free(vbuf);
  aom_free(src_hbuf);
  aom_free(src_vbuf);
  return best_sad;
}